

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_enforce_y_symmetry(REF_GRID ref_grid)

{
  int iVar1;
  REF_STATUS RVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double local_1b8;
  double local_1b0;
  double local_1a0;
  REF_DBL local_190;
  REF_DBL local_188;
  REF_DBL local_180;
  REF_DBL local_178;
  REF_DBL local_170;
  REF_DBL local_168;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT nodes [27];
  int local_d4;
  int local_d0;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT node;
  REF_DBL ymid;
  REF_DBL rel_error;
  REF_DBL bbox [6];
  REF_DBL diag;
  REF_DBL temp;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  int local_50;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT usm3d_type;
  REF_INT bc_type;
  REF_SIZE i;
  REF_SIZE len;
  char *bc_name;
  char *attribute;
  REF_GEOM pRStack_20;
  REF_INT face_id;
  REF_GEOM ref_geom;
  REF_GRID ref_grid_local;
  
  pRStack_20 = ref_grid->geom;
  if (pRStack_20->manifold != 0) {
    bc_name = (char *)0x0;
    ref_geom = (REF_GEOM)ref_grid;
    for (attribute._4_4_ = 1; (int)attribute._4_4_ <= pRStack_20->nface;
        attribute._4_4_ = attribute._4_4_ + 1) {
      RVar2 = ref_egads_get_attribute(pRStack_20,2,attribute._4_4_,"bc_name",&bc_name);
      if (RVar2 == 0) {
        if (bc_name == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x121c,"ref_egads_enforce_y_symmetry","attribute NULL");
          return 2;
        }
        i = strlen(bc_name);
        if (9999 < i) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x121e,"ref_egads_enforce_y_symmetry","attribute more than 10000 bytes");
          return 1;
        }
        if ((long)(i + 1) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x121f,"ref_egads_enforce_y_symmetry","malloc bc_name of char negative");
          return 1;
        }
        len = (REF_SIZE)malloc(i + 1);
        if ((char *)len == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x121f,"ref_egads_enforce_y_symmetry","malloc bc_name of char NULL");
          return 2;
        }
        strcpy((char *)len,bc_name);
        for (_usm3d_type = 0; _usm3d_type < i - 1; _usm3d_type = _usm3d_type + 1) {
          if (*(char *)(len + _usm3d_type) == '_') {
            *(undefined1 *)(len + _usm3d_type) = 10;
            break;
          }
        }
        ref_private_macro_code_rss = atoi((char *)len);
        ref_mpi._4_4_ = ref_phys_usm3d_bc_tag(ref_private_macro_code_rss,&local_50);
        if (ref_mpi._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x1228,"ref_egads_enforce_y_symmetry",(ulong)ref_mpi._4_4_,"usm3d bc tags");
          return ref_mpi._4_4_;
        }
        if (len != 0) {
          free((void *)len);
        }
        if (local_50 == 1) {
          ref_node = *(REF_NODE *)ref_geom;
          ref_cell = *(REF_CELL *)&ref_geom->blank;
          temp = (REF_DBL)ref_geom->initial_cell_height;
          rel_error = 1e+200;
          bbox[0] = -1e+200;
          bbox[1] = 1e+200;
          bbox[2] = -1e+200;
          bbox[3] = 1e+200;
          bbox[4] = -1e+200;
          for (local_d0 = 0; local_d0 < *(int *)((long)temp + 0x2c); local_d0 = local_d0 + 1) {
            RVar2 = ref_cell_nodes((REF_CELL)temp,local_d0,&ref_private_macro_code_rss_2);
            if ((RVar2 == 0) &&
               (attribute._4_4_ == (&ref_private_macro_code_rss_2)[*(int *)((long)temp + 0xc)])) {
              for (local_d4 = 0; local_d4 < *(int *)((long)temp + 0xc); local_d4 = local_d4 + 1) {
                iVar1 = (&ref_private_macro_code_rss_2)[local_d4];
                if (*(double *)(ref_cell->c2n + (long)(iVar1 * 0xf) * 2) <= rel_error) {
                  local_168 = *(REF_DBL *)(ref_cell->c2n + (long)(iVar1 * 0xf) * 2);
                }
                else {
                  local_168 = rel_error;
                }
                rel_error = local_168;
                if (bbox[0] < *(double *)(ref_cell->c2n + (long)(iVar1 * 0xf) * 2) ||
                    bbox[0] == *(double *)(ref_cell->c2n + (long)(iVar1 * 0xf) * 2)) {
                  local_170 = *(REF_DBL *)(ref_cell->c2n + (long)(iVar1 * 0xf) * 2);
                }
                else {
                  local_170 = bbox[0];
                }
                bbox[0] = local_170;
                if (*(double *)(ref_cell->c2n + (long)(iVar1 * 0xf + 1) * 2) <= bbox[1]) {
                  local_178 = *(REF_DBL *)(ref_cell->c2n + (long)(iVar1 * 0xf + 1) * 2);
                }
                else {
                  local_178 = bbox[1];
                }
                bbox[1] = local_178;
                if (bbox[2] < *(double *)(ref_cell->c2n + (long)(iVar1 * 0xf + 1) * 2) ||
                    bbox[2] == *(double *)(ref_cell->c2n + (long)(iVar1 * 0xf + 1) * 2)) {
                  local_180 = *(REF_DBL *)(ref_cell->c2n + (long)(iVar1 * 0xf + 1) * 2);
                }
                else {
                  local_180 = bbox[2];
                }
                bbox[2] = local_180;
                if (*(double *)(ref_cell->c2n + (long)(iVar1 * 0xf + 2) * 2) <= bbox[3]) {
                  local_188 = *(REF_DBL *)(ref_cell->c2n + (long)(iVar1 * 0xf + 2) * 2);
                }
                else {
                  local_188 = bbox[3];
                }
                bbox[3] = local_188;
                if (bbox[4] < *(double *)(ref_cell->c2n + (long)(iVar1 * 0xf + 2) * 2) ||
                    bbox[4] == *(double *)(ref_cell->c2n + (long)(iVar1 * 0xf + 2) * 2)) {
                  local_190 = *(REF_DBL *)(ref_cell->c2n + (long)(iVar1 * 0xf + 2) * 2);
                }
                else {
                  local_190 = bbox[4];
                }
                bbox[4] = local_190;
              }
            }
          }
          diag = rel_error;
          uVar3 = ref_mpi_min((REF_MPI)ref_node,&diag,&rel_error,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0x1244,"ref_egads_enforce_y_symmetry",(ulong)uVar3,"min");
            return uVar3;
          }
          diag = bbox[0];
          uVar3 = ref_mpi_max((REF_MPI)ref_node,&diag,bbox,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0x1246,"ref_egads_enforce_y_symmetry",(ulong)uVar3,"max");
            return uVar3;
          }
          diag = bbox[1];
          uVar3 = ref_mpi_min((REF_MPI)ref_node,&diag,bbox + 1,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0x1248,"ref_egads_enforce_y_symmetry",(ulong)uVar3,"min");
            return uVar3;
          }
          diag = bbox[2];
          uVar3 = ref_mpi_max((REF_MPI)ref_node,&diag,bbox + 2,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0x124a,"ref_egads_enforce_y_symmetry",(ulong)uVar3,"max");
            return uVar3;
          }
          diag = bbox[3];
          uVar3 = ref_mpi_min((REF_MPI)ref_node,&diag,bbox + 3,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0x124c,"ref_egads_enforce_y_symmetry",(ulong)uVar3,"min");
            return uVar3;
          }
          diag = bbox[4];
          uVar3 = ref_mpi_max((REF_MPI)ref_node,&diag,bbox + 4,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c"
                   ,0x124e,"ref_egads_enforce_y_symmetry",(ulong)uVar3,"max");
            return uVar3;
          }
          dVar4 = pow(bbox[0] - rel_error,2.0);
          dVar5 = pow(bbox[4] - bbox[3],2.0);
          dVar4 = sqrt(dVar4 + dVar5);
          if (dVar4 * 1e+20 <= 0.0) {
            local_1a0 = -(dVar4 * 1e+20);
          }
          else {
            local_1a0 = dVar4 * 1e+20;
          }
          if (bbox[2] - bbox[1] <= 0.0) {
            local_1b0 = -(bbox[2] - bbox[1]);
          }
          else {
            local_1b0 = bbox[2] - bbox[1];
          }
          if (local_1b0 < local_1a0) {
            dVar4 = bbox[2] - bbox[1] / dVar4;
            _cell = (bbox[2] + bbox[1]) * 0.5;
            local_1b8 = _cell;
            if (_cell <= 0.0) {
              local_1b8 = -_cell;
            }
            if (local_1b8 < bbox[2] - bbox[1]) {
              _cell = 0.0;
            }
            if (ref_node->max == 0) {
              printf("face %d min %.3e max %.3e relative y error %.3e\n",bbox[1],bbox[2],dVar4,
                     (ulong)attribute._4_4_);
            }
            if (dVar4 < 0.0001) {
              if (ref_node->max == 0) {
                printf("face %d y set to %e\n",_cell,(ulong)attribute._4_4_);
              }
              for (local_d0 = 0; local_d0 < *(int *)((long)temp + 0x2c); local_d0 = local_d0 + 1) {
                RVar2 = ref_cell_nodes((REF_CELL)temp,local_d0,&ref_private_macro_code_rss_2);
                if ((RVar2 == 0) &&
                   (attribute._4_4_ == (&ref_private_macro_code_rss_2)[*(int *)((long)temp + 0xc)]))
                {
                  for (local_d4 = 0; local_d4 < *(int *)((long)temp + 0xc); local_d4 = local_d4 + 1)
                  {
                    *(double *)
                     (ref_cell->c2n +
                     (long)((&ref_private_macro_code_rss_2)[local_d4] * 0xf + 1) * 2) = _cell;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_enforce_y_symmetry(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  if (ref_geom->manifold) {
    REF_INT face_id;
    const char *attribute = NULL;
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      char *bc_name;
      REF_SIZE len, i;
      REF_INT bc_type, usm3d_type;
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_FACE,
                                                 face_id, "bc_name",
                                                 &attribute)) {
        continue;
      }
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len - 1; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = '\n';
          break;
        }
      }
      bc_type = atoi(bc_name);
      RSS(ref_phys_usm3d_bc_tag(bc_type, &usm3d_type), "usm3d bc tags");
      ref_free(bc_name);
      if (1 == usm3d_type) {
        REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
        REF_NODE ref_node = ref_grid_node(ref_grid);
        REF_CELL ref_cell = ref_grid_tri(ref_grid);
        REF_DBL temp, diag, bbox[6], rel_error, ymid;
        REF_INT node, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
        bbox[0] = REF_DBL_MAX;
        bbox[1] = -REF_DBL_MAX;
        bbox[2] = REF_DBL_MAX;
        bbox[3] = -REF_DBL_MAX;
        bbox[4] = REF_DBL_MAX;
        bbox[5] = -REF_DBL_MAX;
        each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
          if (face_id == nodes[ref_cell_id_index(ref_cell)]) {
            each_ref_cell_cell_node(ref_cell, cell_node) {
              node = nodes[cell_node];
              bbox[0] = MIN(bbox[0], ref_node_xyz(ref_node, 0, node));
              bbox[1] = MAX(bbox[1], ref_node_xyz(ref_node, 0, node));
              bbox[2] = MIN(bbox[2], ref_node_xyz(ref_node, 1, node));
              bbox[3] = MAX(bbox[3], ref_node_xyz(ref_node, 1, node));
              bbox[4] = MIN(bbox[4], ref_node_xyz(ref_node, 2, node));
              bbox[5] = MAX(bbox[5], ref_node_xyz(ref_node, 2, node));
            }
          }
        }
        temp = bbox[0];
        RSS(ref_mpi_min(ref_mpi, &temp, &(bbox[0]), REF_DBL_TYPE), "min");
        temp = bbox[1];
        RSS(ref_mpi_max(ref_mpi, &temp, &(bbox[1]), REF_DBL_TYPE), "max");
        temp = bbox[2];
        RSS(ref_mpi_min(ref_mpi, &temp, &(bbox[2]), REF_DBL_TYPE), "min");
        temp = bbox[3];
        RSS(ref_mpi_max(ref_mpi, &temp, &(bbox[3]), REF_DBL_TYPE), "max");
        temp = bbox[4];
        RSS(ref_mpi_min(ref_mpi, &temp, &(bbox[4]), REF_DBL_TYPE), "min");
        temp = bbox[5];
        RSS(ref_mpi_max(ref_mpi, &temp, &(bbox[5]), REF_DBL_TYPE), "max");
        diag = sqrt(pow(bbox[1] - bbox[0], 2) + pow(bbox[5] - bbox[4], 2));
        if (ref_math_divisible(bbox[3] - bbox[2], diag)) {
          rel_error = bbox[3] - bbox[2] / diag;
          ymid = 0.5 * (bbox[3] + bbox[2]);
          if (ABS(ymid) < bbox[3] - bbox[2]) ymid = 0.0;
          if (ref_mpi_once(ref_mpi))
            printf("face %d min %.3e max %.3e relative y error %.3e\n", face_id,
                   bbox[2], bbox[3], rel_error);
          if (rel_error < 1.0e-4) {
            if (ref_mpi_once(ref_mpi))
              printf("face %d y set to %e\n", face_id, ymid);
            each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
              if (face_id == nodes[ref_cell_id_index(ref_cell)]) {
                each_ref_cell_cell_node(ref_cell, cell_node) {
                  node = nodes[cell_node];
                  ref_node_xyz(ref_node, 1, node) = ymid;
                }
              }
            }
          }
        }
      }
    }
  }
  return REF_SUCCESS;
}